

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall ON_PointCloud::Write(ON_PointCloud *this,ON_BinaryArchive *file)

{
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_PointCloud *this_local;
  
  local_19 = ON_BinaryArchive::Write3dmChunkVersion(file,1,2);
  if (local_19) {
    local_19 = ON_BinaryArchive::WriteArray(file,&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WritePlane(file,&this->m_plane);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteBoundingBox(file,&this->m_bbox);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteInt(file,this->m_flags);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteArray(file,&this->m_N);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteArray(file,&this->m_C);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteArray(file,&this->m_V);
  }
  return local_19;
}

Assistant:

bool ON_PointCloud::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.Write3dmChunkVersion(1,2);

  if (rc) rc = file.WriteArray( m_P );
  if (rc) rc = file.WritePlane( m_plane );
  if (rc) rc = file.WriteBoundingBox( m_bbox );
  if (rc) rc = file.WriteInt( m_flags);

  // added for 1.1  (7 December 2005)
  if (rc) rc = file.WriteArray(m_N);
  if (rc) rc = file.WriteArray(m_C);


  // added for 1.2  (8 August 2016)
  if (rc) rc = file.WriteArray(m_V);

  return rc;
}